

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_primitives.h
# Opt level: O2

void tokenize<v_array<substring>>(char delim,substring s,v_array<substring> *ret,bool allow_empty)

{
  char *pcVar1;
  substring temp;
  substring local_40;
  
  v_array<substring>::clear(ret);
  local_40.begin = s.begin;
  for (pcVar1 = local_40.begin; local_40.end = pcVar1, pcVar1 != s.end; pcVar1 = pcVar1 + 1) {
    if (*pcVar1 == delim) {
      if (pcVar1 != local_40.begin || allow_empty) {
        v_array<substring>::push_back(ret,&local_40);
      }
      local_40.begin = pcVar1 + 1;
    }
  }
  if ((allow_empty) || (local_40.begin != s.end)) {
    v_array<substring>::push_back(ret,&local_40);
  }
  return;
}

Assistant:

void tokenize(char delim, substring s, ContainerT& ret, bool allow_empty = false)
{
  ret.clear();
  char* last = s.begin;
  for (; s.begin != s.end; s.begin++)
  {
    if (*s.begin == delim)
    {
      if (allow_empty || (s.begin != last))
      {
        substring temp = {last, s.begin};
        ret.push_back(temp);
      }
      last = s.begin + 1;
    }
  }
  if (allow_empty || (s.begin != last))
  {
    substring final_substring = {last, s.begin};
    ret.push_back(final_substring);
  }
}